

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllocationPolicyManager.h
# Opt level: O3

void __thiscall
AllocationPolicyManager::AllocationPolicyManager
          (AllocationPolicyManager *this,bool needConcurrencySupport)

{
  this->memoryLimit = 0xffffffffffffffff;
  this->currentMemory = 0;
  this->supportConcurrency = needConcurrencySupport;
  (this->cs).super_CCLock.mutexPtr[0] = '\0';
  (this->cs).super_CCLock.mutexPtr[1] = '\0';
  (this->cs).super_CCLock.mutexPtr[2] = '\0';
  (this->cs).super_CCLock.mutexPtr[3] = '\0';
  (this->cs).super_CCLock.mutexPtr[4] = '\0';
  (this->cs).super_CCLock.mutexPtr[5] = '\0';
  (this->cs).super_CCLock.mutexPtr[6] = '\0';
  (this->cs).super_CCLock.mutexPtr[7] = '\0';
  CCLock::Reset(&(this->cs).super_CCLock,true);
  this->context = (void *)0x0;
  this->memoryAllocationCallback = (PageAllocatorMemoryAllocationCallback)0x0;
  if (0 < (long)DAT_015b3850) {
    this->memoryLimit = (long)DAT_015b3850 << 0x14;
  }
  return;
}

Assistant:

AllocationPolicyManager(bool needConcurrencySupport) :
        memoryLimit((size_t)-1),
        currentMemory(0),
        supportConcurrency(needConcurrencySupport),
        context(NULL),
        memoryAllocationCallback(NULL)
    {
        Js::Number limitMB = Js::Configuration::Global.flags.AllocPolicyLimit;
        if (limitMB > 0)
        {
            memoryLimit = (size_t)limitMB * 1024 * 1024;
        }
    }